

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_basics.cpp
# Opt level: O0

bool Am_Object_And_Owners_Valid_And_Visible(Am_Object *obj)

{
  bool bVar1;
  Am_Value *this;
  bool local_49;
  Am_Object local_40 [3];
  byte local_21;
  Am_Object local_20;
  Am_Object *local_18;
  Am_Object *obj_local;
  
  local_18 = obj;
  while( true ) {
    bVar1 = Am_Object::Valid(obj);
    if (!bVar1) {
      return false;
    }
    this = Am_Object::Get(obj,0x69,4);
    bVar1 = Am_Value::operator_cast_to_bool(this);
    if (!bVar1) break;
    bVar1 = Am_Object::operator==(obj,&Am_Screen);
    local_21 = 0;
    local_49 = true;
    if (!bVar1) {
      Am_Object::Get_Prototype(&local_20);
      local_21 = 1;
      local_49 = Am_Object::operator==(&local_20,&Am_Screen);
    }
    if ((local_21 & 1) != 0) {
      Am_Object::~Am_Object(&local_20);
    }
    if (local_49 != false) {
      return true;
    }
    Am_Object::Get_Owner(local_40,(Am_Slot_Flags)obj);
    Am_Object::operator=(obj,local_40);
    Am_Object::~Am_Object(local_40);
  }
  return false;
}

Assistant:

bool
Am_Object_And_Owners_Valid_And_Visible(Am_Object obj)
{
  while (true) {
    if (!obj.Valid())
      return false;
    if (!(bool)obj.Get(Am_VISIBLE, Am_NO_DEPENDENCY))
      return false;
    if (obj == Am_Screen || obj.Get_Prototype() == Am_Screen)
      return true;
    obj = obj.Get_Owner(Am_NO_DEPENDENCY);
  }
}